

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O1

void __thiscall CfdLogger_InitializeLogger_Test::TestBody(CfdLogger_InitializeLogger_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  AssertHelper local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::InitializeLogger();
    }
  }
  else {
    testing::Message::Message((Message *)&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x1f,
               "Expected: (InitializeLogger()) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    if (((local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST(CfdLogger, InitializeLogger) {
  EXPECT_NO_THROW((InitializeLogger()));
}